

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_heap.cpp
# Opt level: O3

void * operator_new(size_t count)

{
  void *pvVar1;
  undefined8 local_20;
  
  unodb::test::allocation_failure_injector::maybe_fail();
  pvVar1 = malloc(count);
  if (pvVar1 == (void *)0x0) {
    operator_new();
    pvVar1 = local_20;
  }
  return pvVar1;
}

Assistant:

void* operator new(std::size_t count) {
  unodb::test::allocation_failure_injector::maybe_fail();
  while (true) {
    // NOLINTNEXTLINE(cppcoreguidelines-no-malloc,cppcoreguidelines-owning-memory,hicpp-no-malloc)
    void* const result = malloc(count);
    if (UNODB_DETAIL_LIKELY(result != nullptr)) return result;
    // LCOV_EXCL_START
    auto* new_handler = std::get_new_handler();
    if (new_handler == nullptr) throw std::bad_alloc{};
    (*new_handler)();
    // LCOV_EXCL_STOP
  }
}